

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void open_multi_files_kvs_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_kvs_handle **ppfVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  size_t valuelen;
  char *ptr_handle;
  fdb_config *fconfig_00;
  uint uVar6;
  ulong uVar7;
  fdb_kvs_handle **doc;
  char *pcVar8;
  fdb_kvs_handle **ptr_iterator;
  char *handle;
  bool bVar9;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_config kvs_config;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  char keybuf [256];
  fdb_config fconfig;
  char fname [256];
  char bodybuf [256];
  fdb_kvs_handle *pfStack_4d10;
  fdb_file_handle *pfStack_4d08;
  void *pvStack_4d00;
  size_t asStack_4cf8 [3];
  undefined4 uStack_4ce0;
  undefined4 uStack_4cdc;
  undefined4 uStack_4cd8;
  undefined4 uStack_4cd4;
  undefined4 uStack_4cd0;
  fdb_kvs_config fStack_4cc8;
  timeval tStack_4cb0;
  fdb_config fStack_4ca0;
  char acStack_4ba8 [256];
  char acStack_4aa8 [256];
  char acStack_49a8 [264];
  fdb_config *pfStack_48a0;
  fdb_kvs_handle **ppfStack_4898;
  fdb_kvs_handle *pfStack_4890;
  fdb_kvs_handle **ppfStack_4888;
  fdb_kvs_handle *pfStack_4880;
  code *pcStack_4878;
  fdb_kvs_handle *pfStack_4860;
  fdb_file_handle *pfStack_4858;
  fdb_kvs_handle *pfStack_4850;
  fdb_kvs_handle *pfStack_4848;
  fdb_kvs_config fStack_4840;
  timeval tStack_4828;
  fdb_config fStack_4818;
  fdb_kvs_handle *apfStack_4720 [32];
  fdb_config fStack_4620;
  fdb_kvs_handle **ppfStack_4518;
  fdb_kvs_handle **ppfStack_4510;
  fdb_kvs_handle **ppfStack_4508;
  fdb_kvs_handle *pfStack_4500;
  fdb_kvs_handle *local_44f0;
  fdb_kvs_handle *local_44e8;
  fdb_kvs_handle **local_44e0;
  fdb_kvs_handle *local_44d8;
  fdb_kvs_config local_44d0;
  undefined1 local_44b8 [128];
  fdb_kvs_handle *local_4438 [33];
  fdb_config local_4330;
  fdb_kvs_handle *local_4238 [32];
  fdb_kvs_handle *local_4138 [32];
  fdb_kvs_handle local_4038;
  undefined8 auStack_3c38 [896];
  fdb_kvs_handle *local_2038 [1025];
  
  pfStack_4500 = (fdb_kvs_handle *)0x118f9c;
  gettimeofday((timeval *)(local_44b8 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_4500 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_4500 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_4500 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_4500 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  local_4330.wal_threshold = 0x400;
  local_4330.compaction_mode = '\0';
  local_4330.durability_opt = '\x02';
  handle = (char *)&local_4038;
  doc = local_4238;
  pcVar8 = "kvs%d";
  uVar7 = 0;
  ptr_iterator = (fdb_kvs_handle **)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)doc,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle = (char *)(local_4438 + (long)ptr_iterator + -10);
    pfStack_4500 = (fdb_kvs_handle *)0x119022;
    fVar2 = fdb_open((fdb_file_handle **)ptr_handle,(char *)doc,&local_4330);
    pfVar5 = (fdb_kvs_handle *)handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar1 = (fdb_kvs_handle **)0x0;
    local_44e0 = ptr_iterator;
    local_44d8 = (fdb_kvs_handle *)handle;
    do {
      ptr_iterator = ppfVar1;
      pfStack_4500 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)doc,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar7));
      pfStack_4500 = (fdb_kvs_handle *)0x11905b;
      fVar2 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)handle,(char *)doc,&local_44d0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_4500 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar1 = (fdb_kvs_handle **)((long)ptr_iterator + 1);
    } while ((fdb_kvs_handle **)((long)ptr_iterator + 1) != (fdb_kvs_handle **)0x80);
    ptr_iterator = (fdb_kvs_handle **)((long)local_44e0 + 1);
    uVar7 = uVar7 + 0x80;
    handle = (char *)&local_44d8[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_kvs_handle **)0x8);
  ptr_iterator = local_4438;
  doc = local_4138;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    uVar7 = 0;
    do {
      pfStack_4500 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ptr_iterator,"key%08d",uVar7);
      pfStack_4500 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)doc,"value%08d",uVar7);
      pcVar8 = *(char **)(&local_4038.kvs_config.create_if_missing + (long)pfVar5 * 8);
      pfStack_4500 = (fdb_kvs_handle *)0x1190e0;
      sVar4 = strlen((char *)ptr_iterator);
      ptr_handle = (char *)(sVar4 + 1);
      pfStack_4500 = (fdb_kvs_handle *)0x1190ec;
      sVar4 = strlen((char *)doc);
      pfStack_4500 = (fdb_kvs_handle *)0x119101;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar8,ptr_iterator,(size_t)ptr_handle,doc,sVar4 + 1);
      handle = (char *)pfVar5;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 10);
    pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
  } while (pfVar5 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_4500 = (fdb_kvs_handle *)0x11912f;
      fVar2 = fdb_commit((fdb_file_handle *)local_4438[(long)ptr_handle + -10],'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_4500 = (fdb_kvs_handle *)0x119142;
      fVar2 = fdb_commit((fdb_file_handle *)local_4438[(long)ptr_handle + -10],'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  doc = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle = (char *)local_2038;
  ptr_iterator = (fdb_kvs_handle **)(local_44b8 + 8);
  pfVar5 = (fdb_kvs_handle *)local_44b8;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_3c38[(long)doc],(fdb_kvs_info *)pfVar5);
    if ((fdb_custom_cmp_variable)local_44b8._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_4500 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_4500 = (fdb_kvs_handle *)0x119199;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3c38[(long)doc],
                              (fdb_kvs_handle **)ptr_handle,local_44b8._8_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    doc = doc + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (doc < (fdb_kvs_handle **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x1191cf;
    fVar2 = fdb_compact((fdb_file_handle *)local_4438[(long)ptr_handle - 10],(char *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&local_44e8;
  local_44e8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &local_44f0;
  handle = "key%08d";
  doc = local_4438;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(local_2038[(long)pfVar5],(fdb_iterator **)ptr_iterator,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar7 = 0;
    do {
      pfStack_4500 = (fdb_kvs_handle *)0x119233;
      fVar2 = fdb_iterator_get((fdb_iterator *)local_44f0,(fdb_doc **)ptr_handle);
      pcVar8 = (char *)pfVar5;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_4500 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)doc,"key%08d",uVar7);
      pfStack_4500 = (fdb_kvs_handle *)0x11925b;
      iVar3 = strcmp((char *)doc,(char *)local_44e8->op_stats);
      if (iVar3 != 0) {
        pfStack_4500 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      pfStack_4500 = (fdb_kvs_handle *)0x11926b;
      fVar2 = fdb_iterator_next((fdb_iterator *)local_44f0);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_4500 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)local_44f0);
    pcVar8 = (char *)&(pfVar5->config).wal_threshold;
    bVar9 = pfVar5 < (fdb_kvs_handle *)0x380;
    pfVar5 = (fdb_kvs_handle *)pcVar8;
  } while (bVar9);
  pfStack_4500 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)local_44e8);
  ptr_handle = "key%08d";
  ptr_iterator = local_4438;
  doc = (fdb_kvs_handle **)0x0;
  do {
    uVar7 = 0;
    do {
      pfStack_4500 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ptr_iterator,"key%08d",uVar7);
      handle = *(char **)(&local_4038.kvs_config.create_if_missing + (long)doc * 8);
      pfStack_4500 = (fdb_kvs_handle *)0x1192dd;
      sVar4 = strlen((char *)ptr_iterator);
      pfStack_4500 = (fdb_kvs_handle *)0x1192ec;
      fVar2 = fdb_del_kv((fdb_kvs_handle *)handle,ptr_iterator,sVar4 + 1);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 10);
    doc = (fdb_kvs_handle **)((long)doc + 1);
  } while (doc != (fdb_kvs_handle **)0x400);
  ptr_handle = "dummy_compact%d";
  ptr_iterator = local_4238;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar5 & 0xffffffff);
    pfStack_4500 = (fdb_kvs_handle *)0x119336;
    fVar2 = fdb_compact((fdb_file_handle *)
                        local_4438[(long)((long)&pfVar5[-1].bub_ctx.space_used + 6)],
                        (char *)ptr_iterator);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
  } while (pfVar5 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&local_44e8;
  local_44e8 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &local_44f0;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_4500 = (fdb_kvs_handle *)0x11937c;
    fVar2 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&local_4038.kvs_config.create_if_missing + (long)handle * 8),
                              (fdb_iterator **)ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar5 = (fdb_kvs_handle *)handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_4500 = (fdb_kvs_handle *)0x119391;
      fVar2 = fdb_iterator_get((fdb_iterator *)local_44f0,(fdb_doc **)ptr_handle);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_4500 = (fdb_kvs_handle *)0x1193a3;
      fVar2 = fdb_iterator_next((fdb_iterator *)local_44f0);
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_4500 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)local_44f0);
    pfVar5 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar9 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar5;
  } while (bVar9);
  pfStack_4500 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)local_44e8);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_4500 = (fdb_kvs_handle *)0x1193db;
    fVar2 = fdb_close((fdb_file_handle *)local_4438[(long)ptr_handle - 10]);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_4500 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_4500 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_4500 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar8,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_4500 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_4500 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_4500 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_4878 = (code *)0x119494;
  ppfStack_4518 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_4510 = doc;
  ppfStack_4508 = ptr_iterator;
  pfStack_4500 = pfVar5;
  gettimeofday(&tStack_4828,(__timezone_ptr_t)0x0);
  pcStack_4878 = (code *)0x119499;
  memleak_start();
  pcStack_4878 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig_00 = &fStack_4818;
  pcStack_4878 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_4878 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_4878 = (code *)0x1194d0;
  fVar2 = fdb_open(&pfStack_4858,"./dummy1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_4878 = (code *)0x1194f3;
    fVar2 = fdb_kvs_open(pfStack_4858,&pfStack_4850,"db",&fStack_4840);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_4878 = (code *)0x119516;
    fVar2 = fdb_kvs_open(pfStack_4858,&pfStack_4848,"db2",&fStack_4840);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    fconfig_00 = &fStack_4620;
    pcStack_4878 = (code *)0x119539;
    sprintf((char *)fconfig_00,"key%d",0);
    ptr_iterator = apfStack_4720;
    pcStack_4878 = (code *)0x119554;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_4878 = (code *)0x11955c;
    pfVar5 = (fdb_kvs_handle *)strlen((char *)fconfig_00);
    pcStack_4878 = (code *)0x119567;
    sVar4 = strlen((char *)ptr_iterator);
    doc = &pfStack_4860;
    pcStack_4878 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)doc,fconfig_00,(size_t)pfVar5,(void *)0x0,0,ptr_iterator,sVar4 + 1);
    pcStack_4878 = (code *)0x119597;
    fVar2 = fdb_set(pfStack_4850,(fdb_doc *)pfStack_4860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_4878 = (code *)0x1195ae;
    fVar2 = fdb_commit(pfStack_4858,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_4878 = (code *)0x1195cf;
    sprintf((char *)(pfStack_4860->field_6).seqtree,"bOdy%d",0);
    pcStack_4878 = (code *)0x1195de;
    fVar2 = fdb_set(pfStack_4848,(fdb_doc *)pfStack_4860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_4878 = (code *)0x1195f5;
    fVar2 = fdb_commit(pfStack_4858,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_4878 = (code *)0x11960c;
    fVar2 = fdb_get_metaonly(pfStack_4850,(fdb_doc *)pfStack_4860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_4878 = (code *)0x119623;
    fVar2 = fdb_get_metaonly(pfStack_4848,(fdb_doc *)pfStack_4860);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_4878 = (code *)0x11963a;
    fVar2 = fdb_get_byoffset(pfStack_4850,(fdb_doc *)pfStack_4860);
    if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_4878 = (code *)0x11964d;
      fdb_close(pfStack_4858);
      pcStack_4878 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_4860);
      pcStack_4878 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_4878 = (code *)0x119661;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_4878 = (code *)0x119692;
      fprintf(_stderr,pcVar8,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_4878 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_4878 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_4878 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_4878 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_4878 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_4878 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_4878 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_4878 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_4878 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_4878 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_48a0 = fconfig_00;
  ppfStack_4898 = doc;
  pfStack_4890 = (fdb_kvs_handle *)pcVar8;
  ppfStack_4888 = ptr_iterator;
  pfStack_4880 = pfVar5;
  pcStack_4878 = (code *)uVar7;
  gettimeofday(&tStack_4cb0,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_4ca0.wal_threshold = 0x400;
  fStack_4ca0.flags = 1;
  fStack_4ca0.purging_interval = 0;
  fStack_4ca0.compaction_threshold = '\0';
  fStack_4ca0.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_4ca0.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_4d08,"./dummy1",&fStack_4ca0);
  fdb_kvs_open_default(pfStack_4d08,&pfStack_4d10,&fStack_4cc8);
  fVar2 = fdb_set_log_callback(pfStack_4d10,logCallbackFunc,"api_wrapper_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_4d10,(void *)0x0,0,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar7 = 0;
    do {
      sprintf(acStack_4aa8,"key%d",uVar7);
      sprintf(acStack_49a8,"body%d",uVar7);
      pfVar5 = pfStack_4d10;
      sVar4 = strlen(acStack_4aa8);
      valuelen = strlen(acStack_49a8);
      fVar2 = fdb_set_kv(pfVar5,acStack_4aa8,sVar4,acStack_49a8,valuelen);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 10);
    asStack_4cf8[1] = 0x726162ffffffff;
    asStack_4cf8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_4ce0 = 0xbdbdbdbd;
    uStack_4cdc = 0xbdbdbdbd;
    uStack_4cd8 = 0xbdbdbdbd;
    uStack_4cd4 = 0xbdbdbdbd;
    uStack_4cd0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar2 = fdb_rekey(pfStack_4d08,new_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_4d10);
    fdb_close(pfStack_4d08);
    fStack_4ca0.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_4ca0.encryption_key.bytes,"bar",4);
    fStack_4ca0.encryption_key.bytes[4] = 0xbd;
    fStack_4ca0.encryption_key.bytes[5] = 0xbd;
    fStack_4ca0.encryption_key.bytes[6] = 0xbd;
    fStack_4ca0.encryption_key.bytes[7] = 0xbd;
    fStack_4ca0.encryption_key.bytes[8] = 0xbd;
    fStack_4ca0.encryption_key.bytes[9] = 0xbd;
    fStack_4ca0.encryption_key.bytes[10] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xb] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xc] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xd] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xe] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0xf] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x10] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x11] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x12] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x13] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x14] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x15] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x16] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x17] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x18] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x19] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1a] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1b] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1c] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1d] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1e] = 0xbd;
    fStack_4ca0.encryption_key.bytes[0x1f] = 0xbd;
    fVar2 = fdb_open(&pfStack_4d08,"./dummy1",&fStack_4ca0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar2 = fdb_kvs_open_default(pfStack_4d08,&pfStack_4d10,&fStack_4cc8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_set_log_callback(pfStack_4d10,logCallbackFunc,"api_wrapper_test");
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar7 = 0;
      while( true ) {
        sprintf(acStack_4aa8,"key%d",uVar7);
        pfVar5 = pfStack_4d10;
        sVar4 = strlen(acStack_4aa8);
        fVar2 = fdb_get_kv(pfVar5,acStack_4aa8,sVar4,&pvStack_4d00,asStack_4cf8);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_4ba8,"body%d",uVar7);
        ptr = pvStack_4d00;
        iVar3 = bcmp(pvStack_4d00,acStack_4ba8,asStack_4cf8[0]);
        if (iVar3 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        if (uVar6 == 10) {
          fdb_kvs_close(pfStack_4d10);
          fdb_close(pfStack_4d08);
          fdb_shutdown();
          memleak_end();
          pcVar8 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar8 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar8,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
LAB_0011943e:
  pfStack_4500 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_4500 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_4500 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_4500 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar5 = (fdb_kvs_handle *)handle;
LAB_00119452:
  pfStack_4500 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_4500 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_4500 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_4500 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_4500 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
}

Assistant:

void open_multi_files_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int vb;
    int n = 10;
    int n_files = 8;
    int n_kvs = 128;
    char keybuf[256], bodybuf[256];
    char fname[256];

    fdb_file_handle **dbfiles = alca(fdb_file_handle*, n_files);
    fdb_kvs_handle **kvs = alca(fdb_kvs_handle*, n_files*n_kvs);
    fdb_kvs_handle **snap_kvs = alca(fdb_kvs_handle*, n_files*n_kvs);
    fdb_iterator *iterator;
    fdb_doc *rdoc;
    fdb_kvs_info kvs_info;
    fdb_status status;

    // remove previous dummy test files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.durability_opt = FDB_DRB_ASYNC;

    // 1024 kvs via 128 per dbfile
    for(j=0;j<n_files;++j){
        sprintf(fname, "dummy%d", j);
        status = fdb_open(&dbfiles[j], fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        for(i=0;i<n_kvs;++i){
            vb = j*n_kvs+i;
            sprintf(fname, "kvs%d", vb);
            status = fdb_kvs_open(dbfiles[j], &kvs[vb], fname, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // load across all kvs
    vb = n_files*n_kvs;
    for(i=0;i<vb;++i){
        for(j=0;j<n;++j){
            sprintf(keybuf, "key%08d", j);
            sprintf(bodybuf, "value%08d", j);
            status = fdb_set_kv(kvs[i], keybuf, strlen(keybuf)+1, bodybuf, strlen(bodybuf)+1);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // commit
    for(j=0;j<n_files;++j){
        if((j%2)==0){
            status = fdb_commit(dbfiles[j], FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            status = fdb_commit(dbfiles[j], FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // snapshot 1 kvs per file
    for(i=0;i<vb;i+=n_kvs){
        fdb_get_kvs_info(kvs[i], &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == (uint64_t)n);
        status = fdb_snapshot_open(kvs[i], &snap_kvs[i], kvs_info.last_seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // compact default
    for(j=0;j<n_files;++j){
        status = fdb_compact(dbfiles[j], NULL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate over snapshots
    rdoc = NULL;
    for(i=0;i<vb;i+=n_kvs){
        j=0;
        fdb_iterator_init(snap_kvs[i], &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
        do {
            // verify keys
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(keybuf, "key%08d", j);
            TEST_CHK(!strcmp(keybuf, (char *)rdoc->key));
            j++;
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);
    }
    fdb_doc_free(rdoc);

    // delete all keys
    vb = n_files*n_kvs;
    for(i=0;i<vb;++i){
        for(j=0;j<n;++j){
            sprintf(keybuf, "key%08d", j);
            status = fdb_del_kv(kvs[i], keybuf, strlen(keybuf)+1);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }


    // custom compact
    for(j=0;j<n_files;++j){
        sprintf(fname, "dummy_compact%d", j);
        status = fdb_compact(dbfiles[j], fname);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate again over actual kvs with no deletes
    rdoc = NULL;
    for(i=0;i<vb;i+=n_kvs){
        status = fdb_iterator_init(kvs[i], &iterator, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        do {
            // verify keys
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);
    }
    fdb_doc_free(rdoc);


    // cleanup
    for(j=0;j<n_files;++j){
        status = fdb_close(dbfiles[j]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("open multi files kvs test");
}